

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fisheye.cpp
# Opt level: O0

void mouseScrollCallback(GLFWwindow *window,double xoffset,double yoffset)

{
  vec3 *a;
  float_t b;
  vec3 vVar1;
  vec3 local_a8;
  vec3 local_98;
  vec3 local_88;
  vec3 local_78;
  vec3 local_68;
  vec3 local_58;
  undefined1 local_4c [8];
  mat3 axis;
  ImGuiIO *io;
  double yoffset_local;
  double xoffset_local;
  GLFWwindow *window_local;
  
  axis.m[2]._4_8_ = ImGui::GetIO();
  ImGui_ImplGlfw_ScrollCallback(window,xoffset,yoffset);
  if ((*(byte *)(axis.m[2]._4_8_ + 0x394) & 1) == 0) {
    dja::transpose((mat3 *)local_4c,&g_camera.axis);
    a = dja::mat3::operator[]((mat3 *)local_4c,0);
    vVar1 = dja::operator*(a,(float)yoffset);
    local_88.z = vVar1.z;
    local_78.z = local_88.z;
    local_88._0_8_ = vVar1._0_8_;
    local_78.x = local_88.x;
    local_78.y = local_88.y;
    vVar1 = dja::operator*(&local_78,0.05);
    local_98.z = vVar1.z;
    local_68.z = local_98.z;
    local_98._0_8_ = vVar1._0_8_;
    local_68.x = local_98.x;
    local_68.y = local_98.y;
    b = dja::norm(&g_camera.pos);
    vVar1 = dja::operator*(&local_68,b);
    local_a8._0_8_ = vVar1._0_8_;
    local_58.x = local_a8.x;
    local_58.y = local_a8.y;
    local_a8.z = vVar1.z;
    local_58.z = local_a8.z;
    dja::operator-=(&g_camera.pos,&local_58);
    g_framebuffer.flags.reset = true;
  }
  return;
}

Assistant:

void mouseScrollCallback(GLFWwindow* window, double xoffset, double yoffset)
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui_ImplGlfw_ScrollCallback(window, xoffset, yoffset);
    if (io.WantCaptureMouse)
        return;

    dja::mat3 axis = dja::transpose(g_camera.axis);
    g_camera.pos-= axis[0] * yoffset * 5e-2 * norm(g_camera.pos);
    g_framebuffer.flags.reset = true;
}